

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

uint64_t sum_quotients<unsigned_long,libdivide::divider<unsigned_long,(libdivide::Branching)1>>
                   (random_numerators<unsigned_long> *vals,
                   divider<unsigned_long,_(libdivide::Branching)1> *div)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  
  if ((ulong)vals->_length != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      uVar1 = *(ulong *)((long)vals->_pData + lVar5);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (div->div).denom.magic;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar1;
      lVar6 = SUB168(auVar2 * auVar3,8);
      uVar4 = uVar4 + ((uVar1 - lVar6 >> 1) + lVar6 >> ((ulong)(div->div).denom.more & 0x3f));
      lVar5 = lVar5 + 8;
    } while ((ulong)vals->_length << 3 != lVar5);
    return uVar4;
  }
  return 0;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}